

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O2

base_learner * classweight_setup(options_i *options,vw *all)

{
  pointer pbVar1;
  int iVar2;
  ostream *poVar3;
  base_learner *l;
  single_learner *base;
  learner<CLASSWEIGHTS::classweights,_example> *plVar4;
  vw_exception *this;
  code *predict;
  code *learn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *source;
  allocator local_29a;
  allocator local_299;
  free_ptr<CLASSWEIGHTS::classweights> cweights;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classweight_array;
  string local_268 [32];
  string local_248;
  string local_228;
  string local_208;
  option_group_definition new_options;
  stringstream __msg;
  undefined1 local_1a0 [376];
  
  classweight_array.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  classweight_array.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  classweight_array.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scoped_calloc_or_throw<CLASSWEIGHTS::classweights>();
  std::__cxx11::string::string((string *)&local_228,"importance weight classes",(allocator *)&__msg)
  ;
  VW::config::option_group_definition::option_group_definition(&new_options,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_248,"classweight",&local_299);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__msg,&local_248,&classweight_array);
  std::__cxx11::string::string(local_268,"importance weight multiplier for class",&local_29a);
  std::__cxx11::string::_M_assign((string *)(local_1a0 + 0x20));
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            (&new_options,
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__msg);
  std::__cxx11::string::~string(local_268);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__msg);
  std::__cxx11::string::~string((string *)&local_248);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&__msg,"classweight",(allocator *)local_268);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  pbVar1 = classweight_array.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  source = classweight_array.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((char)iVar2 == '\0') {
    plVar4 = (learner<CLASSWEIGHTS::classweights,_example> *)0x0;
  }
  else {
    for (; source != pbVar1; source = source + 1) {
      CLASSWEIGHTS::classweights::load_string
                (cweights._M_t.super___uniq_ptr_impl<CLASSWEIGHTS::classweights,_void_(*)(void_*)>.
                 _M_t.super__Tuple_impl<0UL,_CLASSWEIGHTS::classweights_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_CLASSWEIGHTS::classweights_*,_false>._M_head_impl,source);
    }
    if (all->quiet == false) {
      poVar3 = std::operator<<(&(all->trace_message).super_ostream,"parsed ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," class weights");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    if (*(int *)(base + 0xd0) == 4) {
      predict = CLASSWEIGHTS::predict_or_learn<false,4>;
      learn = CLASSWEIGHTS::predict_or_learn<true,4>;
    }
    else {
      if (*(int *)(base + 0xd0) != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<((ostream *)local_1a0,
                        "--classweight not implemented for this type of prediction");
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/classweight.cc"
                   ,100,&local_208);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      predict = CLASSWEIGHTS::predict_or_learn<false,0>;
      learn = CLASSWEIGHTS::predict_or_learn<true,0>;
    }
    plVar4 = LEARNER::
             init_learner<CLASSWEIGHTS::classweights,example,LEARNER::learner<char,example>>
                       (&cweights,base,learn,predict);
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = CLASSWEIGHTS::finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)>::~unique_ptr(&cweights);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&classweight_array);
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* classweight_setup(options_i& options, vw& all)
{
  vector<string> classweight_array;
  auto cweights = scoped_calloc_or_throw<classweights>();
  option_group_definition new_options("importance weight classes");
  new_options.add(make_option("classweight", classweight_array).help("importance weight multiplier for class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("classweight"))
    return nullptr;

  for (auto& s : classweight_array) cweights->load_string(s);

  if (!all.quiet)
    all.trace_message << "parsed " << cweights->weights.size() << " class weights" << endl;

  LEARNER::single_learner* base = as_singleline(setup_base(options, all));

  LEARNER::learner<classweights, example>* ret;
  if (base->pred_type == prediction_type::scalar)
    ret = &LEARNER::init_learner<classweights>(cweights, base, predict_or_learn<true, prediction_type::scalar>,
        predict_or_learn<false, prediction_type::scalar>);
  else if (base->pred_type == prediction_type::multiclass)
    ret = &LEARNER::init_learner<classweights>(cweights, base, predict_or_learn<true, prediction_type::multiclass>,
        predict_or_learn<false, prediction_type::multiclass>);
  else
    THROW("--classweight not implemented for this type of prediction");
  ret->set_finish(finish);
  return make_base(*ret);
}